

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

IntRect __thiscall sf::Font::findGlyphRect(Font *this,Page *page,uint width,uint height)

{
  Texture *this_00;
  pointer *ppRVar1;
  uint uVar2;
  iterator __position;
  float fVar3;
  uint uVar4;
  Vector2u VVar5;
  Vector2u VVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pRVar10;
  uint height_00;
  uint uVar11;
  pointer pRVar12;
  bool bVar13;
  float fVar14;
  IntRect IVar15;
  Texture newTexture;
  Texture local_58;
  
  pRVar12 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pRVar12 ==
      (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar13 = true;
    pRVar10 = (pointer)0x0;
  }
  else {
    fVar3 = 0.0;
    pRVar10 = (pointer)0x0;
    do {
      fVar14 = (float)height / (float)pRVar12->height;
      if ((((0.7 <= fVar14) && (fVar14 <= 1.0)) &&
          (VVar5 = Texture::getSize(&page->texture), width <= VVar5.x - pRVar12->width)) &&
         (fVar3 <= fVar14)) {
        pRVar10 = pRVar12;
        fVar3 = fVar14;
      }
      pRVar12 = pRVar12 + 1;
      bVar13 = pRVar10 == (pointer)0x0;
    } while ((pRVar12 !=
              (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl
              .super__Vector_impl_data._M_finish) && (pRVar10 == (pointer)0x0));
  }
  if (bVar13) {
    uVar11 = (uint)((ulong)height * 0x8cccccccd >> 0x23);
    this_00 = &page->texture;
    while( true ) {
      uVar2 = page->nextRow;
      VVar5 = Texture::getSize(this_00);
      if ((uVar2 + uVar11 < VVar5.y) && (VVar5 = Texture::getSize(this_00), width < VVar5.x)) {
        local_58.m_size.y = page->nextRow;
        local_58.m_size.x = 0;
        __position._M_current =
             (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_58.m_actualSize.x = uVar11;
          std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::
          _M_realloc_insert<sf::Font::Row>(&page->rows,__position,(Row *)&local_58);
        }
        else {
          (__position._M_current)->height = uVar11;
          (__position._M_current)->width = (int)((ulong)local_58.m_size.y << 0x20);
          (__position._M_current)->top = (int)(((ulong)local_58.m_size.y << 0x20) >> 0x20);
          ppRVar1 = &(page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppRVar1 = *ppRVar1 + 1;
        }
        page->nextRow = page->nextRow + uVar11;
        pRVar10 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1;
        bVar13 = true;
        goto LAB_00154017;
      }
      VVar5 = Texture::getSize(this_00);
      VVar6 = Texture::getSize(this_00);
      uVar2 = VVar5.x * 2;
      uVar4 = Texture::getMaximumSize();
      if (uVar4 < uVar2) break;
      height_00 = (uint)((ulong)VVar6 >> 0x1f) & 0xfffffffe;
      uVar4 = Texture::getMaximumSize();
      if (uVar4 < height_00) break;
      Texture::Texture(&local_58);
      Texture::create(&local_58,uVar2,height_00);
      Texture::setSmooth(&local_58,this->m_isSmooth);
      Texture::update(&local_58,this_00);
      Texture::swap(this_00,&local_58);
      Texture::~Texture(&local_58);
    }
    poVar7 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "Failed to add a new character to the font: the maximum texture size has been reached"
               ,0x54);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    bVar13 = false;
    pRVar10 = (pointer)0x0;
LAB_00154017:
    if (!bVar13) {
      uVar9 = 0x200000002;
      uVar8 = 0;
      goto LAB_00154048;
    }
  }
  uVar8._0_4_ = pRVar10->width;
  uVar8._4_4_ = pRVar10->top;
  pRVar10->width = pRVar10->width + width;
  uVar9 = CONCAT44(height,width);
LAB_00154048:
  IVar15.width = (int)uVar9;
  IVar15.height = (int)((ulong)uVar9 >> 0x20);
  IVar15.left = (int)uVar8;
  IVar15.top = (int)((ulong)uVar8 >> 0x20);
  return IVar15;
}

Assistant:

IntRect Font::findGlyphRect(Page& page, unsigned int width, unsigned int height) const
{
    // Find the line that fits well the glyph
    Row* row = NULL;
    float bestRatio = 0;
    for (std::vector<Row>::iterator it = page.rows.begin(); it != page.rows.end() && !row; ++it)
    {
        float ratio = static_cast<float>(height) / static_cast<float>(it->height);

        // Ignore rows that are either too small or too high
        if ((ratio < 0.7f) || (ratio > 1.f))
            continue;

        // Check if there's enough horizontal space left in the row
        if (width > page.texture.getSize().x - it->width)
            continue;

        // Make sure that this new row is the best found so far
        if (ratio < bestRatio)
            continue;

        // The current row passed all the tests: we can select it
        row = &*it;
        bestRatio = ratio;
    }

    // If we didn't find a matching row, create a new one (10% taller than the glyph)
    if (!row)
    {
        unsigned int rowHeight = height + height / 10;
        while ((page.nextRow + rowHeight >= page.texture.getSize().y) || (width >= page.texture.getSize().x))
        {
            // Not enough space: resize the texture if possible
            unsigned int textureWidth  = page.texture.getSize().x;
            unsigned int textureHeight = page.texture.getSize().y;
            if ((textureWidth * 2 <= Texture::getMaximumSize()) && (textureHeight * 2 <= Texture::getMaximumSize()))
            {
                // Make the texture 2 times bigger
                Texture newTexture;
                newTexture.create(textureWidth * 2, textureHeight * 2);
                newTexture.setSmooth(m_isSmooth);
                newTexture.update(page.texture);
                page.texture.swap(newTexture);
            }
            else
            {
                // Oops, we've reached the maximum texture size...
                err() << "Failed to add a new character to the font: the maximum texture size has been reached" << std::endl;
                return IntRect(0, 0, 2, 2);
            }
        }

        // We can now create the new row
        page.rows.push_back(Row(page.nextRow, rowHeight));
        page.nextRow += rowHeight;
        row = &page.rows.back();
    }

    // Find the glyph's rectangle on the selected row
    IntRect rect(Rect<unsigned int>(row->width, row->top, width, height));

    // Update the row informations
    row->width += width;

    return rect;
}